

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O3

cJSON_bool print_number(cJSON *item,printbuffer *output_buffer)

{
  uchar uVar1;
  uint uVar2;
  int iVar3;
  lconv *plVar4;
  uchar *puVar5;
  ulong uVar6;
  ulong uVar7;
  cJSON_bool cVar8;
  uchar uVar9;
  ulong needed;
  long in_FS_OFFSET;
  double in_XMM0_Qa;
  double test;
  uchar number_buffer [26];
  double local_60;
  uchar local_58 [40];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  plVar4 = localeconv();
  cVar8 = 0;
  if (item == (cJSON *)0x0) goto LAB_00104a2d;
  uVar1 = *plVar4->decimal_point;
  if ((in_XMM0_Qa * 0.0 != 0.0) || (NAN(in_XMM0_Qa * 0.0))) {
    builtin_memcpy(local_58,"null",5);
    puVar5 = ensure((printbuffer *)item,4);
    uVar7 = 4;
    cVar8 = 0;
    if (puVar5 == (uchar *)0x0) goto LAB_00104a2d;
LAB_00104972:
    uVar6 = 0;
    do {
      uVar9 = local_58[uVar6];
      if (local_58[uVar6] == uVar1) {
        uVar9 = '.';
      }
      puVar5[uVar6] = uVar9;
      uVar6 = uVar6 + 1;
      needed = uVar7;
    } while (uVar7 != uVar6);
  }
  else {
    uVar2 = sprintf((char *)local_58,"%1.15g");
    iVar3 = __isoc99_sscanf(local_58,"%lg",&local_60);
    if (iVar3 == 1) {
      if ((local_60 != in_XMM0_Qa) || (NAN(local_60) || NAN(in_XMM0_Qa))) goto LAB_001049ec;
    }
    else {
LAB_001049ec:
      uVar2 = sprintf((char *)local_58,"%1.17g");
    }
    cVar8 = 0;
    if (0x19 < uVar2) goto LAB_00104a2d;
    needed = (ulong)uVar2;
    puVar5 = ensure((printbuffer *)item,needed);
    if (puVar5 == (uchar *)0x0) goto LAB_00104a2d;
    uVar7 = needed;
    if (uVar2 != 0) goto LAB_00104972;
    uVar7 = 0;
  }
  puVar5[uVar7] = '\0';
  item->child = (cJSON *)((long)&item->child->next + needed);
  cVar8 = 1;
LAB_00104a2d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return cVar8;
}

Assistant:

static cJSON_bool print_number(const cJSON * const item, printbuffer * const output_buffer)
{
    unsigned char *output_pointer = NULL;
    double d = item->valuedouble;
    int length = 0;
    size_t i = 0;
    unsigned char number_buffer[26]; /* temporary buffer to print the number into */
    unsigned char decimal_point = get_decimal_point();
    double test;

    if (output_buffer == NULL)
    {
        return false;
    }

    /* This checks for NaN and Infinity */
    if ((d * 0) != 0)
    {
        length = sprintf((char*)number_buffer, "null");
    }
    else
    {
        /* Try 15 decimal places of precision to avoid nonsignificant nonzero digits */
        length = sprintf((char*)number_buffer, "%1.15g", d);

        /* Check whether the original double can be recovered */
        if ((sscanf((char*)number_buffer, "%lg", &test) != 1) || ((double)test != d))
        {
            /* If not, print with 17 decimal places of precision */
            length = sprintf((char*)number_buffer, "%1.17g", d);
        }
    }

    /* sprintf failed or buffer overrun occured */
    if ((length < 0) || (length > (int)(sizeof(number_buffer) - 1)))
    {
        return false;
    }

    /* reserve appropriate space in the output */
    output_pointer = ensure(output_buffer, (size_t)length);
    if (output_pointer == NULL)
    {
        return false;
    }

    /* copy the printed number to the output and replace locale
     * dependent decimal point with '.' */
    for (i = 0; i < ((size_t)length); i++)
    {
        if (number_buffer[i] == decimal_point)
        {
            output_pointer[i] = '.';
            continue;
        }

        output_pointer[i] = number_buffer[i];
    }
    output_pointer[i] = '\0';

    output_buffer->offset += (size_t)length;

    return true;
}